

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O1

void Interactor_Input_Event_Notify(Am_Object *event_window,Am_Input_Event *ev)

{
  short *psVar1;
  Deferred_Event_Holder *pDVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ushort uVar6;
  int iVar7;
  Am_Inter_State AVar8;
  Am_Value *pAVar9;
  ostream *poVar10;
  Am_Wrapper *pAVar11;
  Am_Priority_List *this;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  Am_Value_List *pAVar12;
  undefined7 uVar13;
  int iVar14;
  Am_Object *pAVar15;
  Deferred_Event_Holder *this_00;
  Am_Object obj_1;
  Am_Object owner_1;
  float local_164;
  float this_priority;
  Am_Input_Char deferring;
  Am_Value run_also_value;
  Am_Object local_148;
  Am_Object local_140;
  Am_Object head;
  Am_Value local_118;
  Am_Object inter_1;
  Am_Object local_f0 [3];
  int local_d4;
  ulong local_d0;
  int local_c0;
  undefined4 uStack_bc;
  Am_Value_List run_also_list;
  Am_Object owner;
  anon_union_8_8_ea4c8939_for_value local_a0;
  Am_Value inter_list_value;
  Am_Object run_also_object;
  Am_Object inter;
  Am_Object local_70;
  Am_Value *local_68;
  ulong local_60;
  ulong local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  bVar3 = Am_Value_List::Empty(&Am_Modal_Windows);
  if (!bVar3) {
    head.data = (Am_Object_Data *)0x0;
    Am_Value_List::Start(&Am_Modal_Windows);
    pAVar9 = Am_Value_List::Get(&Am_Modal_Windows);
    Am_Object::operator=(&head,pAVar9);
    bVar3 = Am_Object::operator==(&head,event_window);
    if (bVar3) {
      Am_Object::~Am_Object(&head);
    }
    else {
      Am_Object::Get_Object(&owner,(Am_Slot_Key)event_window,10);
      while( true ) {
        bVar3 = Am_Object::Valid(&owner);
        if (bVar3) {
          Am_Object::Am_Object(&inter_1,&Am_Screen);
          bVar3 = Am_Object::Is_Instance_Of(&owner,&inter_1);
          bVar3 = !bVar3;
          Am_Object::~Am_Object(&inter_1);
        }
        else {
          bVar3 = false;
        }
        if (!bVar3) break;
        bVar5 = Am_Object::operator==(&owner,&head);
        if (bVar5) goto LAB_001b02f4;
        Am_Object::Get_Object((Am_Object *)&inter_list_value,(Am_Slot_Key)&owner,10);
        Am_Object::operator=(&owner,(Am_Object *)&inter_list_value);
        Am_Object::~Am_Object((Am_Object *)&inter_list_value);
      }
      uVar6 = *(ushort *)&(ev->input_char).field_0x2;
      if ((uVar6 & 0xf0) == 0x10 || (uVar6 & 0xf00) == 0) {
        Am_Object::Am_Object((Am_Object *)&run_also_value,&Am_No_Object);
        Am_Beep((Am_Object *)&run_also_value);
        Am_Object::~Am_Object((Am_Object *)&run_also_value);
      }
LAB_001b02f4:
      Am_Object::~Am_Object(&owner);
      Am_Object::~Am_Object(&head);
      if (!bVar3) {
        return;
      }
    }
  }
  if (Am_List_Of_Deferred_Events != (Deferred_Event_Holder *)0x0) {
    local_f0[0].data = (Am_Object_Data *)0x0;
    bVar3 = false;
    this_00 = Am_List_Of_Deferred_Events;
    do {
      pDVar2 = this_00->next;
      uVar6 = *(ushort *)&(ev->input_char).field_0x2;
      bVar5 = true;
      if ((uVar6 & 0xf00) == 0 || (uVar6 & 0xf0) == 0x10) {
LAB_001b03f5:
        bVar4 = false;
      }
      else {
        bVar4 = Am_Object::operator!=(&this_00->event_window,event_window);
        if (bVar4) {
LAB_001b03dd:
          uVar6 = *(ushort *)&(this_00->want_ic).field_0x2 >> 4 & 0xf;
          if (uVar6 == 4) goto LAB_001b03f5;
          if (uVar6 != 5) goto LAB_001b03f9;
LAB_001b03f1:
          bVar4 = true;
        }
        else {
          iVar7 = this_00->x - ev->x;
          iVar14 = -iVar7;
          if (0 < iVar7) {
            iVar14 = iVar7;
          }
          if (Am_Minimum_Move_For_Drag <= iVar14) goto LAB_001b03dd;
          iVar7 = this_00->y - ev->y;
          iVar14 = -iVar7;
          if (0 < iVar7) {
            iVar14 = iVar7;
          }
          if (Am_Minimum_Move_For_Drag <= iVar14) goto LAB_001b03dd;
          if ((*(ushort *)&(ev->input_char).field_0x2 & 0xf0) == 0x20) {
            uVar6 = *(ushort *)&(this_00->want_ic).field_0x2 >> 4 & 0xf;
            if (uVar6 != 4) {
              if (uVar6 == 5) goto LAB_001b03f5;
              goto LAB_001b03f9;
            }
            goto LAB_001b03f1;
          }
LAB_001b03f9:
          bVar4 = false;
        }
        bVar5 = false;
      }
      if (bVar4) {
        Am_Object::Am_Object(&inter_1,&this_00->inter);
        Am_Object::Am_Object((Am_Object *)&inter_list_value,&inter_1);
        if (am_trace_next_inter == true) {
          am_trace_next_inter = false;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\n>> ** Interactor ",0x12);
          poVar10 = operator<<((ostream *)&std::cout,(Am_Object *)&inter_list_value);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," started.  Starting tracing\n",0x1c);
          std::ostream::flush();
          Am_Object::Am_Object(&head,(Am_Object *)&inter_list_value);
          Am_Set_Inter_Trace(&head);
          Am_Object::~Am_Object(&head);
        }
        Am_Object::~Am_Object((Am_Object *)&inter_list_value);
        Am_Object::Am_Object((Am_Object *)&run_also_value,&this_00->event_window);
        Am_Object::Am_Object((Am_Object *)&run_also_list,&this_00->obj);
        Am_Input_Char::Am_Input_Char
                  ((Am_Input_Char *)&head,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
        local_118.type = 0;
        local_118.value.wrapper_value = (Am_Wrapper *)0x0;
        iVar14 = this_00->x;
        iVar7 = this_00->y;
        head.data._2_2_ = *(ushort *)&(this_00->got_ic).field_0x2 & 0xfff | head.data._2_2_ & 0xf000
        ;
        head.data._0_2_ = (this_00->got_ic).code;
        Am_Object::Am_Object(&owner_1,(Am_Object *)&run_also_value);
        Get_a_drawonable(&owner_1);
        Am_Object::~Am_Object(&owner_1);
        Am_List_Of_Deferred_Events = this_00->next;
        Am_Object::~Am_Object(&this_00->obj);
        Am_Object::~Am_Object(&this_00->event_window);
        Am_Object::~Am_Object(&this_00->inter);
        operator_delete(this_00);
        pAVar11 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&run_also_value);
        Am_Object::Set(&inter_1,0x68,pAVar11,0);
        pAVar11 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&run_also_list);
        Am_Object::Set(&inter_1,0x11a,pAVar11,0);
        pAVar11 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&run_also_list);
        Am_Object::Set(&inter_1,0x119,pAVar11,0);
        Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&head);
        Am_Object::Set(&inter_1,0x11b,(Am_Value *)&owner,0);
        Am_Value::~Am_Value((Am_Value *)&owner);
        Am_Object::Set(&inter_1,0x11f,iVar14,0);
        Am_Object::Set(&inter_1,0x120,iVar7,0);
        Am_Object::Set(&inter_1,0x121,iVar14,0);
        Am_Object::Set(&inter_1,0x122,iVar7,0);
        pAVar9 = Am_Object::Get(&inter_1,0xbe,0);
        Am_Inter_Internal_Method::Am_Inter_Internal_Method
                  ((Am_Inter_Internal_Method *)&owner,pAVar9);
        (*local_a0.proc_value)(&inter_1,&run_also_list,&run_also_value,&head);
        bVar3 = Am_Object::Valid((Am_Object *)&run_also_value);
        if (bVar3) {
          Am_Object::Am_Object(&local_140,(Am_Object *)&run_also_value);
          set_want_move_one_win(&local_140,false);
          Am_Object::~Am_Object(&local_140);
        }
        Am_Value::~Am_Value(&local_118);
        Am_Object::~Am_Object((Am_Object *)&run_also_list);
        Am_Object::~Am_Object((Am_Object *)&run_also_value);
        Am_Object::~Am_Object(&inter_1);
LAB_001b0765:
        bVar3 = true;
      }
      else if (bVar5) {
        Am_Object::Am_Object(&head,&this_00->event_window);
        set_want_move_one_win(&head,false);
        Am_Object::~Am_Object(&head);
        Am_List_Of_Deferred_Events = this_00->next;
        Am_Object::~Am_Object(&this_00->obj);
        Am_Object::~Am_Object(&this_00->event_window);
        Am_Object::~Am_Object(&this_00->inter);
        operator_delete(this_00);
        goto LAB_001b0765;
      }
      this_00 = pDVar2;
    } while (pDVar2 != (Deferred_Event_Holder *)0x0);
    Am_Object::~Am_Object(local_f0);
    if (bVar3) {
      return;
    }
  }
  pAVar9 = Am_Object::Get(event_window,0x124,1);
  Am_Value::Am_Value(&inter_list_value,pAVar9);
  bVar3 = Am_Value::Valid(&inter_list_value);
  if (bVar3) {
    this = (Am_Priority_List *)Am_Value::operator_cast_to_void_(&inter_list_value);
  }
  else {
    this = (Am_Priority_List *)0x0;
  }
  inter.data = (Am_Object_Data *)0x0;
  run_also_value.type = 0;
  run_also_value.value.wrapper_value = (Am_Wrapper *)0x0;
  run_also_object.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&run_also_list);
  if (this != (Am_Priority_List *)0x0) {
    this->refs = this->refs + 1;
    Am_Priority_List::Start(this);
  }
  Am_Priority_List::Start(all_wins_inter_list);
  local_68 = &ev->user_id;
  local_164 = 0.0;
  local_d0 = 0;
  bVar3 = false;
  local_58 = 0;
  local_60 = 0;
LAB_001b0873:
  do {
    bVar5 = Am_Priority_List::Two_List_Get_Next(all_wins_inter_list,this,&inter,&this_priority);
    if (!bVar5) {
LAB_001b1564:
      if (this != (Am_Priority_List *)0x0) {
        psVar1 = &this->refs;
        *psVar1 = *psVar1 + -1;
        if (*psVar1 == 0) {
          operator_delete(this);
        }
      }
      Am_Value_List::~Am_Value_List(&run_also_list);
      Am_Object::~Am_Object(&run_also_object);
      Am_Value::~Am_Value(&run_also_value);
      Am_Object::~Am_Object(&inter);
      Am_Value::~Am_Value(&inter_list_value);
      return;
    }
    bVar5 = Am_Object::Valid(&inter);
  } while (!bVar5);
  if ((((local_d0 & 1) != 0) && (!bVar3)) && (this_priority < local_164)) goto LAB_001b1564;
  if ((local_60 & 1) != 0) {
    Am_Value_List::Start(&run_also_list);
  }
  if ((local_d0 & 1) != 0) {
    if (bVar3) {
      if (((local_58 & 1) != 0) && (bVar5 = Am_Object::operator==(&inter,&run_also_object), bVar5))
      goto LAB_001b094e;
      if ((local_60 & 1) == 0) goto LAB_001b0873;
      pAVar11 = Am_Object::operator_cast_to_Am_Wrapper_(&inter);
      bVar5 = Am_Value_List::Member(&run_also_list,pAVar11);
    }
    else {
      pAVar9 = Am_Object::Get(&inter,0x11c,0);
      bVar5 = Am_Value::Valid(pAVar9);
    }
    if (bVar5 == false) goto LAB_001b0873;
  }
LAB_001b094e:
  Am_Object::Set(&Am_Screen,499,local_68,0);
  pAVar9 = Am_Object::Get(&inter,0x1f1,1);
  bVar5 = Am_Value::operator==(pAVar9,-2);
  if (bVar5) {
    pAVar9 = Am_Object::Get(&inter,0x1f2,1);
    bVar5 = Am_Value::Valid(pAVar9);
    if ((bVar5) && (bVar5 = Am_Value::operator==(pAVar9,local_68), !bVar5)) {
      bVar5 = Am_Value::operator==(pAVar9,-2);
LAB_001b09f4:
      if (bVar5 == false) goto LAB_001b0873;
    }
  }
  else {
    bVar5 = Am_Value::operator==(pAVar9,-1);
    if (!bVar5) {
      bVar5 = Am_Value::operator==(pAVar9,local_68);
      goto LAB_001b09f4;
    }
  }
  inter_1.data = (Am_Object_Data *)0x0;
  Am_Object::Am_Object(&local_38,&inter);
  AVar8 = Am_Get_Inter_State(&local_38);
  Am_Object::~Am_Object(&local_38);
  pAVar9 = Am_Object::Get(&inter,0xcc,0);
  bVar5 = Am_Value::operator_cast_to_bool(pAVar9);
  deferring = Am_No_Input_Char;
  obj_1.data = (Am_Object_Data *)0x0;
  if (bVar5) {
    if (AVar8 - Am_INTER_RUNNING < 2) {
      pAVar11 = Am_Object::operator_cast_to_Am_Wrapper_(event_window);
      Am_Object::Set(&inter,0x68,pAVar11,0);
      Am_Object::Set(&inter,0x121,ev->x,0);
      Am_Object::Set(&inter,0x122,ev->y,0);
      Am_Object::Am_Object(&local_70,&inter);
      if (am_trace_next_inter == true) {
        am_trace_next_inter = false;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\n>> ** Interactor ",0x12);
        poVar10 = operator<<((ostream *)&std::cout,&local_70);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10," started.  Starting tracing\n",0x1c);
        std::ostream::flush();
        Am_Object::Am_Object(&head,&local_70);
        Am_Set_Inter_Trace(&head);
        Am_Object::~Am_Object(&head);
      }
      Am_Object::~Am_Object(&local_70);
      bVar5 = check_event(&inter,event_window,ev->input_char,0xbc,&deferring);
      if (bVar5) {
        pAVar9 = Am_Object::Get(&inter,0xd3,0);
        bVar5 = Am_Value::operator_cast_to_bool(pAVar9);
        if (bVar5) {
          Am_Object::Am_Object(&local_50,&Am_No_Object);
          Am_Beep(&local_50);
          Am_Object::~Am_Object(&local_50);
        }
        pAVar9 = Am_Object::Get(&inter,0xc4,0);
        Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar9);
        pAVar15 = &Am_No_Object;
LAB_001b0dc0:
        (*(code *)0x0)(&inter,pAVar15,event_window,ev);
      }
      else {
        local_d4 = ev->y;
        local_148.data = (Am_Object_Data *)0x0;
        head.data = head.data & 0xffffffffffff0000;
        pAVar9 = Am_Object::Get(&inter,0xbb,1);
        Am_Value::operator=((Am_Value *)&head,pAVar9);
        if (((Am_Value_Type)head.data == 4) || ((Am_Value_Type)head.data == 2)) {
          bVar5 = Am_Value::Valid((Am_Value *)&head);
          pAVar15 = event_window;
          if (!bVar5) {
            pAVar15 = &Am_No_Object;
          }
          Am_Object::operator=(&local_148,pAVar15);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"** Amulet Error: Contents of Am_RUNNING_WHERE_TEST slot"
                     ,0x37);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," of inter ",10);
          poVar10 = operator<<((ostream *)&std::cerr,&inter);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," is not Boolean or Am_Where_Method, type = ",0x2b);
          Am_Print_Type((ostream *)&std::cerr,(Am_Value_Type)head.data);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," Aborting\n",10)
          ;
          Am_Object::operator=(&local_148,&Am_No_Object);
          Am_Error(&inter,0xbb);
        }
        Am_Value::~Am_Value((Am_Value *)&head);
        Am_Object::operator=(&obj_1,&local_148);
        Am_Object::~Am_Object(&local_148);
        bVar5 = check_event(&inter,event_window,ev->input_char,0xbd,&deferring);
        bVar4 = Am_Object::Valid(&obj_1);
        if (bVar4) {
          pAVar11 = Am_Object::operator_cast_to_Am_Wrapper_(&obj_1);
          Am_Object::Set(&inter,0x119,pAVar11,0);
          if (AVar8 == Am_INTER_OUTSIDE) {
            pAVar9 = Am_Object::Get(&inter,0xc1,0);
            Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar9);
            (*(code *)0x0)(&inter,&obj_1,event_window,ev);
          }
          if (bVar5) {
            pAVar9 = Am_Object::Get(&inter,0xc2,0);
            Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar9);
            pAVar15 = &obj_1;
          }
          else {
            pAVar9 = Am_Object::Get(&inter,0xbf,0);
            Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar9);
            pAVar15 = &obj_1;
          }
        }
        else {
          if (AVar8 == Am_INTER_RUNNING) {
            pAVar9 = Am_Object::Get(&inter,0xc0,0);
            Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar9);
            (*(code *)0x0)(&inter,&Am_No_Object,event_window,ev);
          }
          if (!bVar5) goto LAB_001b1223;
          pAVar9 = Am_Object::Get(&inter,0xc3,0);
          Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar9);
          pAVar15 = &Am_No_Object;
        }
        (*(code *)0x0)(&inter,pAVar15,event_window,ev);
      }
LAB_001b1223:
      Am_Object::~Am_Object(&obj_1);
      bVar5 = Am_Object::Valid(&inter);
      uVar13 = extraout_var;
      if (bVar5) {
        pAVar9 = Am_Object::Get(&inter,0x11c,1);
        Am_Value::operator=(&run_also_value,pAVar9);
        bVar5 = Am_Value::Valid(&run_also_value);
        uVar13 = extraout_var_00;
        if (bVar5) {
          bVar5 = Am_Value_List::Test(&run_also_value);
          if (bVar5) {
            pAVar12 = Am_Value_List::operator=(&run_also_list,&run_also_value);
            uVar13 = (undefined7)((ulong)pAVar12 >> 8);
            local_d0 = CONCAT71(uVar13,1);
            local_164 = this_priority;
            bVar3 = true;
            local_60 = CONCAT71(uVar13,1);
          }
          else if (run_also_value.type == 0xa001) {
            pAVar15 = Am_Object::operator=(&run_also_object,&run_also_value);
            uVar13 = (undefined7)((ulong)pAVar15 >> 8);
            local_d0 = CONCAT71(uVar13,1);
            local_164 = this_priority;
            bVar3 = true;
            local_58 = CONCAT71(uVar13,1);
          }
          goto LAB_001b0873;
        }
      }
      local_d0 = CONCAT71(uVar13,1);
      local_164 = this_priority;
      goto LAB_001b0873;
    }
    if (AVar8 != Am_INTER_ANIMATING) {
      if (AVar8 != Am_INTER_WAITING) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"** Amulet Error: Illegal state in Interactor ",0x2d);
        poVar10 = operator<<((ostream *)&std::cerr,&inter);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        Am_Error(&inter,0x123);
        goto LAB_001b1223;
      }
      bVar5 = check_event(&inter,event_window,ev->input_char,0xb9,&deferring);
      if (bVar5) {
        local_d4 = ev->x;
        _local_c0 = CONCAT44(uStack_bc,ev->y);
        local_148.data = (Am_Object_Data *)0x0;
        head.data = head.data & 0xffffffffffff0000;
        Am_Object::Get_Object(&owner_1,(Am_Slot_Key)&inter,10);
        pAVar9 = Am_Object::Get(&inter,0xba,1);
        Am_Value::operator=((Am_Value *)&head,pAVar9);
        if (((Am_Value_Type)head.data != 4) && ((Am_Value_Type)head.data != 2)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Am_START_WHERE_TEST of ",0x17);
          poVar10 = operator<<((ostream *)&std::cerr,&inter);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," should be boolean or Am_Where_Method, but is ",0x2e);
          poVar10 = operator<<(poVar10,(Am_Value *)&head);
          std::endl<char,std::char_traits<char>>(poVar10);
          Am_Error();
        }
        bVar5 = Am_Value::Valid((Am_Value *)&head);
        pAVar15 = &owner_1;
        if (!bVar5) {
          pAVar15 = &Am_No_Object;
        }
        Am_Object::operator=(&local_148,pAVar15);
        Am_Object::~Am_Object(&owner_1);
        Am_Value::~Am_Value((Am_Value *)&head);
        Am_Object::operator=(&obj_1,&local_148);
        Am_Object::~Am_Object(&local_148);
        bVar5 = Am_Object::Valid(&obj_1);
        if (bVar5) {
          if (deferring.code == 0) {
            Am_Object::Am_Object(&local_48,&inter);
            Check_And_Handle_Trace_Next_Inter(&local_48);
            Am_Object::~Am_Object(&local_48);
            pAVar11 = Am_Object::operator_cast_to_Am_Wrapper_(event_window);
            Am_Object::Set(&inter,0x68,pAVar11,0);
            pAVar11 = Am_Object::operator_cast_to_Am_Wrapper_(&obj_1);
            Am_Object::Set(&inter,0x11a,pAVar11,0);
            pAVar11 = Am_Object::operator_cast_to_Am_Wrapper_(&obj_1);
            Am_Object::Set(&inter,0x119,pAVar11,0);
            Am_Input_Char::operator_cast_to_Am_Value(&ev->input_char);
            Am_Object::Set(&inter,0x11b,(Am_Value *)&head,0);
            Am_Value::~Am_Value((Am_Value *)&head);
            Am_Object::Set(&inter,0x11f,ev->x,0);
            Am_Object::Set(&inter,0x120,ev->y,0);
            Am_Object::Set(&inter,0x121,ev->x,0);
            Am_Object::Set(&inter,0x122,ev->y,0);
            pAVar9 = Am_Object::Get(&inter,0xbe,0);
            Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar9);
            pAVar15 = &obj_1;
            goto LAB_001b0dc0;
          }
          set_inter_deferred(&inter,ev,event_window,&obj_1,deferring);
        }
      }
    }
  }
  else if (AVar8 != Am_INTER_WAITING) {
    pAVar9 = Am_Object::Get(&inter,0xd3,0);
    bVar5 = Am_Value::operator_cast_to_bool(pAVar9);
    if (bVar5) {
      Am_Object::Am_Object(&local_40,&Am_No_Object);
      Am_Beep(&local_40);
      Am_Object::~Am_Object(&local_40);
    }
    pAVar9 = Am_Object::Get(&inter,0xc4,0);
    Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar9);
    (*(code *)0x0)(&inter,&Am_No_Object,event_window,ev);
  }
  Am_Object::~Am_Object(&obj_1);
  goto LAB_001b0873;
}

Assistant:

static void
Interactor_Input_Event_Notify(Am_Object event_window, Am_Input_Event *ev)
{
  //first check if modal window
  if (check_modal_windows(event_window, ev))
    return;

  //now check if a deferred interactor wants this event
  if (check_deferred_events(ev, event_window)) {
    return;
  }

#ifdef DEBUG
  int was_inprogress =
      event_window.Get(Am_OBJECT_IN_PROGRESS, Am_RETURN_ZERO_ON_ERROR);
  if (was_inprogress & 2) {
    std::cerr << "** Processing events for window " << event_window
              << " but crashed last time, so skipping it.\n"
              << std::flush;
    return; //skip this object
  } else
    event_window.Set(Am_OBJECT_IN_PROGRESS, 2, Am_OK_IF_NOT_THERE);
#endif

  Am_Value inter_list_value = event_window.Peek(Am_INTER_LIST);
  Am_Priority_List *inter_list;
  bool wants_event;

  if (inter_list_value.Valid()) {
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                         "----Interactors for window " << event_window);
    inter_list = Am_Priority_List::Narrow(inter_list_value);
  } else {
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                         "----NO Interactors for window " << event_window);
    // no interactor list, still have to check global ones so don't exit
    inter_list = nullptr;
  }

  // process all the interactors in inter_list in priority order

  Am_Object inter;
  Am_Value run_also_value;
  Am_Object run_also_object;
  Am_Value_List run_also_list;
  bool doing_RUN_ALSO_only = false; //true if found an inter w/run_also
  bool check_RUN_ALSO_list_or_object = false;
  bool check_RUN_ALSO_object = false;
  bool check_RUN_ALSO_list = false;
  float run_also_priority = 0.0f;
  float this_priority;

  if (inter_list) {
    inter_list->Note_Reference();
    inter_list->Start();
  }
  all_wins_inter_list->Start();

  //std::cout <<"\nGlobal list: " << *all_wins_inter_list << endl
  //  << "List of " << event_window << " = " << *inter_list <<std::endl <<std::flush;

  while (all_wins_inter_list->Two_List_Get_Next(inter_list, inter,
                                                this_priority)) {
    //go through inter_list and all_wins_inter_list in parallel,
    //always getting the next priority inter from each

    // std::cout << "-<.> processing " << inter << " doing_RUN_ALSO_only "
    //      << doing_RUN_ALSO_only << " check_RUN_ALSO_list_or_object "
    //      << check_RUN_ALSO_list_or_object << " run_also_object= "
    //	  << run_also_object << " run_also_list " << run_also_list
    //	  <<std::endl <<std::flush;

    // Sometimes the window gets destroyed and all these interactors are
    // destroyed as well.  Must check to make sure interactors are okay.
    if (!inter.Valid())
      continue;

    if (doing_RUN_ALSO_only &&
        !check_RUN_ALSO_list_or_object) { // then found a regular inter, stop when priority is lower than
      // run_also_priority
      if (this_priority < run_also_priority)
        break; // then done.
    }          // end if (doing_RUN_ALSO_only)

    // std::cout << "__check " << inter << " doing run also=" << doing_RUN_ALSO_only
    //   << " inter runalso=" << (bool)inter.Get(Am_RUN_ALSO) <<std::endl <<std::flush;

    if (check_RUN_ALSO_list)
      run_also_list.Start();

    if ((!doing_RUN_ALSO_only ||
         (check_RUN_ALSO_list_or_object &&
              // if the run_also object is set then inter must be that object
              ((check_RUN_ALSO_object && inter == run_also_object) ||
          // if the run_also list is set then inter must be member of list
          (check_RUN_ALSO_list && run_also_list.Member(inter)))) ||
         //inter itself is a run_also
         (!check_RUN_ALSO_list_or_object && inter.Get(Am_RUN_ALSO).Valid())) &&
        // supports multiple users
        inter_is_go_for_user_and_event(inter, ev)) {
      //--> The actual running of the Interactor is here <--//
      wants_event = Inter_Check_Go(inter, ev, event_window);

      if (wants_event) {
        // Found one to run.  If it is not a RUN_ALSO_only, then only
        // run the RUN_ALSO interactors of the same priority level.
        // If it is a RUN_ALSO, then just keep going.
        // Be sure to fetch Am_RUN_ALSO again after Inter_Check_Go in
        // case changed by the running.
        if (inter.Valid()) {
          //inter might be destroyed while running
          run_also_value = inter.Peek(Am_RUN_ALSO);
          if (!run_also_value.Valid()) {
            //when Am_RUN_ALSO is not valid, then only run other
            // RUN_ALSO interactors.
            doing_RUN_ALSO_only = true;
            run_also_priority = this_priority;
          } else { //valid, see if object or list or ==true
            if (Am_Value_List::Test(run_also_value)) {
              run_also_list = run_also_value;
              doing_RUN_ALSO_only = true;
              run_also_priority = this_priority;
              check_RUN_ALSO_list = true;
              check_RUN_ALSO_list_or_object = true;
            } else if (run_also_value.type == Am_OBJECT) {
              run_also_object = run_also_value;
              doing_RUN_ALSO_only = true;
              run_also_priority = this_priority;
              check_RUN_ALSO_object = true;
              check_RUN_ALSO_list_or_object = true;
            }
            //else must be ==true, so continue to run other
            //interactors (leave doing_RUN_ALSO_only as false)
          }
        } else {
          // inter destroyed while running, but still only run other
          // run_also interactors.
          doing_RUN_ALSO_only = true;
          run_also_priority = this_priority;
        }
      }
    }
  }
  if (inter_list)
    inter_list->Release();
#ifdef DEBUG
  if (event_window.Valid()) //may not be valid while destroying window
    event_window.Set(Am_OBJECT_IN_PROGRESS, 0, Am_OK_IF_NOT_THERE);
#endif
}